

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O3

bool __thiscall wasm::Literal::isNegative(Literal *this)

{
  ulong uVar1;
  byte bVar2;
  
  uVar1 = (this->type).id;
  if (uVar1 < 7) {
    switch((int)uVar1) {
    case 2:
    case 4:
      bVar2 = (byte)((uint)(this->field_0).i32 >> 0x18);
      break;
    case 3:
    case 5:
      bVar2 = (byte)((this->field_0).func.super_IString.str._M_len >> 0x38);
      break;
    default:
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                         ,0x8b);
    }
    return (bool)(bVar2 >> 7);
  }
  __assert_fail("isBasic() && \"Basic type expected\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x1c4,"BasicType wasm::Type::getBasic() const");
}

Assistant:

bool isNegative() const {
    switch (type.getBasic()) {
      case Type::i32:
      case Type::f32:
        return i32 < 0;
      case Type::i64:
      case Type::f64:
        return i64 < 0;
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }